

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferObjectQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_2::BufferOffsetLengthCase::testBuffer
          (BufferOffsetLengthCase *this)

{
  BufferParamVerifier *pBVar1;
  int local_3c;
  int ndx;
  BufferRange ranges [4];
  BufferOffsetLengthCase *this_local;
  
  pBVar1 = (this->super_BufferCase).m_verifier;
  (*pBVar1->_vptr_BufferParamVerifier[2])
            (pBVar1,(this->super_BufferCase).super_ApiCase.super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx,(ulong)(this->super_BufferCase).m_bufferTarget,0x9121,0
            );
  pBVar1 = (this->super_BufferCase).m_verifier;
  (*pBVar1->_vptr_BufferParamVerifier[2])
            (pBVar1,(this->super_BufferCase).super_ApiCase.super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx,(ulong)(this->super_BufferCase).m_bufferTarget,0x9120,0
            );
  glu::CallLogWrapper::glBufferData
            (&(this->super_BufferCase).super_ApiCase.super_CallLogWrapper,
             (this->super_BufferCase).m_bufferTarget,0x10,(void *)0x0,0x88ea);
  ranges[0].offset = 4;
  ranges[0].length = 0xc;
  ranges[1].offset = 0;
  ranges[1].length = 0xc;
  ranges[2].offset = 8;
  ranges[2].length = 8;
  for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
    glu::CallLogWrapper::glMapBufferRange
              (&(this->super_BufferCase).super_ApiCase.super_CallLogWrapper,
               (this->super_BufferCase).m_bufferTarget,(long)ranges[(long)local_3c + -1].offset,
               (long)ranges[(long)local_3c + -1].length,2);
    ApiCase::expectError((ApiCase *)this,0);
    pBVar1 = (this->super_BufferCase).m_verifier;
    (*pBVar1->_vptr_BufferParamVerifier[2])
              (pBVar1,(this->super_BufferCase).super_ApiCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx,(ulong)(this->super_BufferCase).m_bufferTarget,0x9121
               ,(ulong)(uint)ranges[(long)local_3c + -1].offset);
    pBVar1 = (this->super_BufferCase).m_verifier;
    (*pBVar1->_vptr_BufferParamVerifier[2])
              (pBVar1,(this->super_BufferCase).super_ApiCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx,(ulong)(this->super_BufferCase).m_bufferTarget,0x9120
               ,(ulong)(uint)ranges[(long)local_3c + -1].length);
    ApiCase::expectError((ApiCase *)this,0);
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_BufferCase).super_ApiCase.super_CallLogWrapper,
               (this->super_BufferCase).m_bufferTarget);
    ApiCase::expectError((ApiCase *)this,0);
  }
  return;
}

Assistant:

void testBuffer (void)
	{
		m_verifier->verifyInteger(m_testCtx, m_bufferTarget, GL_BUFFER_MAP_OFFSET, 0);
		m_verifier->verifyInteger(m_testCtx, m_bufferTarget, GL_BUFFER_MAP_LENGTH, 0);

		glBufferData(m_bufferTarget, 16, DE_NULL, GL_DYNAMIC_COPY);

		const struct BufferRange
		{
			int offset;
			int length;
		} ranges[] =
		{
			{ 0, 16 },
			{ 4, 12 },
			{ 0, 12 },
			{ 8,  8 },
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(ranges); ++ndx)
		{
			glMapBufferRange(m_bufferTarget, ranges[ndx].offset, ranges[ndx].length, GL_MAP_WRITE_BIT);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_bufferTarget, GL_BUFFER_MAP_OFFSET, ranges[ndx].offset);
			m_verifier->verifyInteger(m_testCtx, m_bufferTarget, GL_BUFFER_MAP_LENGTH, ranges[ndx].length);
			expectError(GL_NO_ERROR);

			glUnmapBuffer(m_bufferTarget);
			expectError(GL_NO_ERROR);
		}
	}